

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MultiMemoryLowering.cpp
# Opt level: O2

Expression * __thiscall
wasm::MultiMemoryLowering::Replacer::makeDataSegmentBoundsCheck
          (Replacer *this,MemoryInit *curr,Index sizeIdx,Index offsetIdx)

{
  Builder *this_00;
  DataSegment *pDVar1;
  LocalGet *leftOperand;
  LocalGet *rightOperand;
  Const *limit;
  Expression *pEVar2;
  
  pDVar1 = Module::getDataSegment(this->parent->wasm,(Name)(curr->segment).super_IString.str);
  this_00 = &this->builder;
  leftOperand = Builder::makeLocalGet(this_00,offsetIdx,(Type)(this->parent->pointerType).id);
  rightOperand = Builder::makeLocalGet(this_00,sizeIdx,(Type)(this->parent->pointerType).id);
  limit = Builder::makeConstPtr
                    (this_00,(long)(pDVar1->data).super__Vector_base<char,_std::allocator<char>_>.
                                   _M_impl.super__Vector_impl_data._M_finish -
                             (long)(pDVar1->data).super__Vector_base<char,_std::allocator<char>_>.
                                   _M_impl.super__Vector_impl_data._M_start,
                     (Type)(this->parent->pointerType).id);
  pEVar2 = makeAddGtuTrap(this,(Expression *)leftOperand,(Expression *)rightOperand,
                          (Expression *)limit);
  return pEVar2;
}

Assistant:

Expression* makeDataSegmentBoundsCheck(MemoryInit* curr,
                                           Index sizeIdx,
                                           Index offsetIdx) {
      auto* segment = parent.wasm->getDataSegment(curr->segment);
      Expression* addGtuTrap = makeAddGtuTrap(
        builder.makeLocalGet(offsetIdx, parent.pointerType),
        builder.makeLocalGet(sizeIdx, parent.pointerType),
        builder.makeConstPtr(segment->data.size(), parent.pointerType));
      return addGtuTrap;
    }